

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O1

char * current_line(void)

{
  char *pcVar1;
  
  pcVar1 = current_line::buf;
  sprintf(current_line::buf,"at line %d in file %s:\\n%s",(ulong)(linenum - 1),finname,
          (ulong)(whichbuf == 0) * 0x2000 + 0x1382ce);
  do {
    if (*pcVar1 == '\n') {
      *pcVar1 = '\0';
    }
    else if (*pcVar1 == '\0') {
      return current_line::buf;
    }
    if (*pcVar1 == '\"') {
      *pcVar1 = '\'';
    }
    pcVar1 = pcVar1 + 1;
  } while( true );
}

Assistant:

char* current_line() { /* assumes we actually want the previous line */
	static char buf[NRN_BUFSIZE];
	char* p;
	sprintf(buf,"at line %d in file %s:\\n%s", linenum-1, finname,
		inlinebuf[whichbuf?0:1]+30);
	for (p = buf; *p; ++p) {
		if (*p == '\n') {
			*p = '\0';
		}
		if (*p == '"') {
			*p = '\047';
		}
	}
	return buf;
}